

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoOptimize(Fts3Table *p,int bReturnDone)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int in_ESI;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  int iLangid;
  int i;
  int rc2;
  int rc;
  int bSeenDone;
  sqlite3_stmt *pAllLangid;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  int iVar4;
  Fts3Table *p_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  p_00 = (Fts3Table *)0x0;
  local_38 = sqlite3Fts3PendingTermsFlush
                       ((Fts3Table *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (local_38 == 0) {
    local_38 = fts3SqlStmt(p_00,(int)((ulong)in_RDI >> 0x20),(sqlite3_stmt **)CONCAT44(in_ESI,iVar4)
                           ,(sqlite3_value **)(ulong)in_stack_ffffffffffffffd8);
  }
  if (local_38 == 0) {
    sqlite3_bind_int((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    sqlite3_bind_int((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    while (iVar3 = sqlite3_step(in_RDI), iVar3 == 100) {
      in_stack_ffffffffffffffd0 =
           sqlite3_column_int((sqlite3_stmt *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffd4 = 0;
      while( true ) {
        bVar2 = false;
        if (local_38 == 0) {
          bVar2 = in_stack_ffffffffffffffd4 < *(int *)(in_RDI + 0x1ec);
        }
        if (!bVar2) break;
        local_38 = fts3SegmentMerge(p_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
        if (local_38 == 0x65) {
          iVar4 = 1;
          local_38 = 0;
        }
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
      }
    }
    iVar3 = sqlite3_reset((sqlite3_stmt *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_38 == 0) {
      local_38 = iVar3;
    }
  }
  sqlite3Fts3SegmentsClose((Fts3Table *)0x254a9b);
  if (((local_38 == 0) && (in_ESI != 0)) && (iVar4 != 0)) {
    local_38 = 0x65;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

static int fts3DoOptimize(Fts3Table *p, int bReturnDone){
  int bSeenDone = 0;
  int rc;
  sqlite3_stmt *pAllLangid = 0;

  rc = sqlite3Fts3PendingTermsFlush(p);
  if( rc==SQLITE_OK ){
    rc = fts3SqlStmt(p, SQL_SELECT_ALL_LANGID, &pAllLangid, 0);
  }
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int(pAllLangid, 1, p->iPrevLangid);
    sqlite3_bind_int(pAllLangid, 2, p->nIndex);
    while( sqlite3_step(pAllLangid)==SQLITE_ROW ){
      int i;
      int iLangid = sqlite3_column_int(pAllLangid, 0);
      for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
        rc = fts3SegmentMerge(p, iLangid, i, FTS3_SEGCURSOR_ALL);
        if( rc==SQLITE_DONE ){
          bSeenDone = 1;
          rc = SQLITE_OK;
        }
      }
    }
    rc2 = sqlite3_reset(pAllLangid);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  sqlite3Fts3SegmentsClose(p);

  return (rc==SQLITE_OK && bReturnDone && bSeenDone) ? SQLITE_DONE : rc;
}